

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

array<unsigned_int,_3UL> __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getTextureSize
          (ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *this)

{
  array<unsigned_int,_3UL> aVar1;
  string local_38;
  
  if (this->deviceBufferType == Attribute) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"managed buffer is not a texture","");
    exception(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  aVar1._M_elems[0] = this->sizeX;
  aVar1._M_elems[1] = this->sizeY;
  aVar1._M_elems[2] = this->sizeZ;
  return (array<unsigned_int,_3UL>)aVar1._M_elems;
}

Assistant:

std::array<uint32_t, 3> ManagedBuffer<T>::getTextureSize() const {
  if (deviceBufferType == DeviceBufferType::Attribute) exception("managed buffer is not a texture");
  return std::array<uint32_t, 3>{sizeX, sizeY, sizeZ};
}